

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucm.cpp
# Opt level: O1

void ucm_printTable(UCMTable *table,FILE *f,UBool byUnicode)

{
  int32_t *piVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  UCMapping *m;
  
  m = table->mappings;
  uVar3 = table->mappingsLength;
  uVar4 = (ulong)uVar3;
  if (byUnicode == '\0') {
    if (0 < (int)uVar3) {
      piVar1 = table->reverseMap;
      uVar2 = 0;
      do {
        ucm_printMapping(table,m + piVar1[uVar2],f);
        uVar2 = uVar2 + 1;
      } while (uVar4 != uVar2);
    }
  }
  else if (0 < (int)uVar3) {
    do {
      ucm_printMapping(table,m,f);
      m = m + 1;
      uVar3 = (int)uVar4 - 1;
      uVar4 = (ulong)uVar3;
    } while (uVar3 != 0);
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
ucm_printTable(UCMTable *table, FILE *f, UBool byUnicode) {
    UCMapping *m;
    int32_t i, length;

    m=table->mappings;
    length=table->mappingsLength;
    if(byUnicode) {
        for(i=0; i<length; ++m, ++i) {
            ucm_printMapping(table, m, f);
        }
    } else {
        const int32_t *map=table->reverseMap;
        for(i=0; i<length; ++i) {
            ucm_printMapping(table, m+map[i], f);
        }
    }
}